

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O3

void blend_a64_mask_b10_sy_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  uint8_t *puVar5;
  long lVar6;
  undefined1 in_XMM0 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  uint16_t uVar17;
  
  puVar5 = mask + mask_stride;
  auVar7 = pmovsxbw(in_XMM0,0x4040404040404040);
  do {
    if (0 < w) {
      lVar6 = 0;
      do {
        uVar3 = *(ulong *)(mask + lVar6);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar3;
        uVar4 = *(undefined8 *)(puVar5 + lVar6);
        auVar9[0] = pavgb((char)uVar4,(char)uVar3);
        auVar9[1] = pavgb((char)((ulong)uVar4 >> 8),(char)(uVar3 >> 8));
        auVar9[2] = pavgb((char)((ulong)uVar4 >> 0x10),(char)(uVar3 >> 0x10));
        auVar9[3] = pavgb((char)((ulong)uVar4 >> 0x18),(char)(uVar3 >> 0x18));
        auVar9[4] = pavgb((char)((ulong)uVar4 >> 0x20),(char)(uVar3 >> 0x20));
        auVar9[5] = pavgb((char)((ulong)uVar4 >> 0x28),(char)(uVar3 >> 0x28));
        auVar9[6] = pavgb((char)((ulong)uVar4 >> 0x30),(char)(uVar3 >> 0x30));
        auVar9[7] = pavgb((char)((ulong)uVar4 >> 0x38),(char)(uVar3 >> 0x38));
        auVar9[8] = pavgb(0,0);
        auVar9[9] = pavgb(0,0);
        auVar9[10] = pavgb(0,0);
        auVar9[0xb] = pavgb(0,0);
        auVar9[0xc] = pavgb(0,0);
        auVar9[0xd] = pavgb(0,0);
        auVar9[0xe] = pavgb(0,0);
        auVar9[0xf] = pavgb(0,0);
        auVar8 = pmovzxbw(auVar8,auVar9);
        puVar1 = src0 + lVar6;
        puVar2 = src1 + lVar6;
        uVar10 = pavgw((ushort)(*puVar1 * auVar8._0_2_ + *puVar2 * (auVar7._0_2_ - auVar8._0_2_)) >>
                       5,0);
        uVar11 = pavgw((ushort)(puVar1[1] * auVar8._2_2_ + puVar2[1] * (auVar7._2_2_ - auVar8._2_2_)
                               ) >> 5,0);
        uVar12 = pavgw((ushort)(puVar1[2] * auVar8._4_2_ + puVar2[2] * (auVar7._4_2_ - auVar8._4_2_)
                               ) >> 5,0);
        uVar13 = pavgw((ushort)(puVar1[3] * auVar8._6_2_ + puVar2[3] * (auVar7._6_2_ - auVar8._6_2_)
                               ) >> 5,0);
        uVar14 = pavgw((ushort)(puVar1[4] * auVar8._8_2_ + puVar2[4] * (auVar7._8_2_ - auVar8._8_2_)
                               ) >> 5,0);
        uVar15 = pavgw((ushort)(puVar1[5] * auVar8._10_2_ +
                               puVar2[5] * (auVar7._10_2_ - auVar8._10_2_)) >> 5,0);
        uVar16 = pavgw((ushort)(puVar1[6] * auVar8._12_2_ +
                               puVar2[6] * (auVar7._12_2_ - auVar8._12_2_)) >> 5,0);
        uVar17 = pavgw((ushort)(puVar1[7] * auVar8._14_2_ +
                               puVar2[7] * (auVar7._14_2_ - auVar8._14_2_)) >> 5,0);
        puVar1 = dst + lVar6;
        *puVar1 = uVar10;
        puVar1[1] = uVar11;
        puVar1[2] = uVar12;
        puVar1[3] = uVar13;
        puVar1[4] = uVar14;
        puVar1[5] = uVar15;
        puVar1[6] = uVar16;
        puVar1[7] = uVar17;
        lVar6 = lVar6 + 8;
      } while ((int)lVar6 < w);
    }
    mask = mask + mask_stride * 2;
    dst = dst + dst_stride;
    src1 = src1 + src1_stride;
    src0 = src0 + src0_stride;
    puVar5 = puVar5 + mask_stride * 2;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_b10_sy_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  blend_a64_mask_bn_sy_w8n_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                                  src1_stride, mask, mask_stride, w, h,
                                  blend_8_b10);
}